

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall
ON_SerialNumberMap::RemoveId(ON_SerialNumberMap *this,ON__UINT64 sn,ON_UUID id)

{
  long lVar1;
  long lVar2;
  ON__UINT32 OVar3;
  SN_ELEMENT *pSVar4;
  uint uVar5;
  SN_ELEMENT **ppSVar6;
  SN_ELEMENT *e;
  SN_ELEMENT *pSVar7;
  long local_20;
  uchar local_18 [8];
  
  local_18 = id.Data4;
  local_20 = id._0_8_;
  if (((this->m_active_id_count != 0) && (local_20 != 0 || local_18 != (uchar  [8])0x0)) &&
     ((lVar1._0_4_ = (this->m_inactive_id).Data1, lVar1._4_2_ = (this->m_inactive_id).Data2,
      lVar1._6_2_ = (this->m_inactive_id).Data3, lVar1 != local_20 ||
      (*&(this->m_inactive_id).Data4 != local_18)))) {
    if (this->m_bHashTableIsValid == '\0') {
      if (sn == 0) {
        pSVar4 = Internal_HashTableFindId(this,id,0,false);
        if (pSVar4 != (SN_ELEMENT *)0x0) goto LAB_004d00b3;
      }
      else {
        pSVar4 = FindElementHelper(this,sn);
        if ((pSVar4 != (SN_ELEMENT *)0x0) && (pSVar4->m_sn_active != '\0')) {
LAB_004d00b3:
          pSVar4 = Internal_HashTableRemoveElement(this,pSVar4,true);
          return pSVar4;
        }
      }
      Internal_HashTableBuild(this);
    }
    OVar3 = ON_CRC32(0,0x10,&local_20);
    uVar5 = OVar3 / 0xffa + (OVar3 / 0xff4024) * -0xffa;
    pSVar4 = this->m_hash_table_blocks[(ulong)OVar3 % (ulong)this->m_hash_block_count][uVar5];
    if (pSVar4 != (SN_ELEMENT *)0x0) {
      pSVar7 = (SN_ELEMENT *)0x0;
      do {
        e = pSVar4;
        lVar2._0_4_ = (e->m_id).Data1;
        lVar2._4_2_ = (e->m_id).Data2;
        lVar2._6_2_ = (e->m_id).Data3;
        if ((lVar2 == local_20) && (*&(e->m_id).Data4 == local_18)) {
          ppSVar6 = &pSVar7->m_next;
          if (pSVar7 == (SN_ELEMENT *)0x0) {
            ppSVar6 = this->m_hash_table_blocks[(ulong)OVar3 % (ulong)this->m_hash_block_count] +
                      uVar5;
          }
          *ppSVar6 = e->m_next;
          pSVar4 = Internal_HashTableRemoveElement(this,e,false);
          return pSVar4;
        }
        pSVar4 = e->m_next;
        pSVar7 = e;
      } while (e->m_next != (SN_ELEMENT *)0x0);
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* 
ON_SerialNumberMap::RemoveId(ON__UINT64 sn, ON_UUID id)
{
  if ( m_active_id_count > 0 && IdIsNotNil(&id) && IdIsNotEqual(&id,&m_inactive_id))
  {
    struct SN_ELEMENT* e;
    if ( false == m_bHashTableIsValid )
    {
      if (sn > 0)
      {
        // We can avoid rebuilding the hash table.
        // Use the serial number to find the element.
        e = FindSerialNumber(sn);
        if (nullptr != e)
          return Internal_HashTableRemoveElement(e,true);
      }
      else
      {
        // check most recently added elements
        e = Internal_HashTableFindId(id, 0, false);
        if (nullptr != e)
        {
          // got lucky
          return Internal_HashTableRemoveElement(e,true);
        }
      }
      
      // have to build hash table (expensive)
      Internal_HashTableBuild();
    }

    const ON__UINT32 id_crc32 = IdCRC32(&id);
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(id_crc32);
    struct SN_ELEMENT* prev = nullptr;
    for (e = hash_table_block[hash_i]; nullptr != e; e = e->m_next)
    {
      if ( IdIsEqual(&e->m_id,&id) )
      {
        if (nullptr != prev)
          prev->m_next = e->m_next;
        else
          hash_table_block[hash_i] = e->m_next;
        return Internal_HashTableRemoveElement(e,false);
      }
      prev = e;
    }
  }

  return nullptr;
}